

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemengine_unix.cpp
# Opt level: O1

bool QFileSystemEngine::fillMetaData
               (QFileSystemEntry *entry,QFileSystemMetaData *data,MetaDataFlags what)

{
  byte *pbVar1;
  bool bVar2;
  int iVar3;
  MetaDataFlags MVar4;
  void *pvVar5;
  int *piVar6;
  uint uVar7;
  char *pcVar8;
  char *__file;
  char *b;
  int iVar9;
  QFlagsStorage<QFileSystemMetaData::MetaDataFlag> QVar10;
  long lVar11;
  long in_FS_OFFSET;
  anon_union_256_2_7f119113 anon_var_1;
  QString local_178;
  NativePath local_158;
  statx local_138;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = QFileSystemEntry::isEmpty(entry);
  if (!bVar2) {
    QFileSystemEntry::nativeFilePath((NativePath *)&local_138,entry);
    if ((CONCAT44(local_138.stx_uid,local_138.stx_nlink) == 0) ||
       (pvVar5 = memchr((void *)local_138.stx_attributes,0,
                        CONCAT44(local_138.stx_uid,local_138.stx_nlink)), pvVar5 == (void *)0x0)) {
      lVar11 = -1;
    }
    else {
      lVar11 = (long)pvVar5 - local_138.stx_attributes;
    }
    piVar6 = (int *)CONCAT62(local_138._2_6_,
                             CONCAT11(local_138.stx_mask._1_1_,(undefined1)local_138.stx_mask));
    if (piVar6 != (int *)0x0) {
      LOCK();
      *piVar6 = *piVar6 + -1;
      UNLOCK();
      if (*piVar6 == 0) {
        QArrayData::deallocate
                  ((QArrayData *)
                   CONCAT62(local_138._2_6_,
                            CONCAT11(local_138.stx_mask._1_1_,(undefined1)local_138.stx_mask)),1,
                   0x10);
      }
    }
    if (lVar11 == -1) {
      QVar10.i = (uint)what.super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
                       super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i | 0x72a67077;
      if (((uint)what.super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
                 super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i & 0x72a67077) == 0) {
        QVar10.i = (Int)what.super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
                        super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i;
      }
      (data->entryFlags).super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
      super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i =
           (data->entryFlags).super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
           super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i & ~QVar10.i;
      local_158.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_158.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_158.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
      QFileSystemEntry::nativeFilePath(&local_158,entry);
      memset(&local_138,0xaa,0x100);
      iVar9 = 0;
      if ((QVar10.i >> 0x10 & 1) == 0) {
LAB_00171013:
        if ((QVar10.i & 0x72a67077) != 0) {
          if (iVar9 == 0) {
            (data->entryFlags).super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
            super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i =
                 (data->entryFlags).super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
                 super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i & 0x8d598f88;
            pcVar8 = local_158.d.ptr;
            if ((statx *)local_158.d.ptr == (statx *)0x0) {
              pcVar8 = "";
            }
            iVar3 = qt_real_statx(-100,pcVar8,0,&local_138);
            if (iVar3 == 0) {
              MVar4 = flagsFromStMode((uint)local_138.stx_mode,(quint64)pcVar8);
              uVar7 = (data->entryFlags).
                      super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
                      super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i |
                      (uint)MVar4.super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
                            super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i;
              (data->entryFlags).super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
              super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i = uVar7;
              (data->knownFlagsMask).super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>
              .super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i =
                   (uint)MVar4.super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
                         super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i |
                   (data->knownFlagsMask).
                   super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
                   super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i | 0x72a67077;
              if (local_138.stx_nlink == 0) {
                (data->entryFlags).super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
                super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i = uVar7 | 0x40000000;
              }
              data->size_ = local_138.stx_size;
              data->accessTime_ =
                   (long)(local_138.stx_atime.tv_sec * 1000000000 +
                         (ulong)local_138.stx_atime.tv_nsec) / 1000000;
              data->metadataChangeTime_ =
                   (long)(local_138.stx_ctime.tv_sec * 1000000000 +
                         (ulong)local_138.stx_ctime.tv_nsec) / 1000000;
              data->modificationTime_ =
                   (long)(local_138.stx_mtime.tv_sec * 1000000000 +
                         (ulong)local_138.stx_mtime.tv_nsec) / 1000000;
              if ((local_138.stx_mask._1_1_ & 8) == 0) {
                lVar11 = 0;
              }
              else {
                lVar11 = (long)(local_138.stx_btime.tv_sec * 1000000000 +
                               (ulong)local_138.stx_btime.tv_nsec) / 1000000;
              }
              data->birthTime_ = lVar11;
              data->userId_ = local_138.stx_uid;
              data->groupId_ = local_138.stx_gid;
              goto LAB_00171054;
            }
            if (iVar3 == -0x26) {
              pcVar8 = local_158.d.ptr;
              if ((statx *)local_158.d.ptr == (statx *)0x0) {
                pcVar8 = "";
              }
              iVar3 = stat64(pcVar8,(stat64 *)&local_138);
              if (iVar3 == 0) {
                QFileSystemMetaData::fillFromStatBuf(data,(stat64 *)&local_138);
                goto LAB_00171054;
              }
            }
          }
          piVar6 = __errno_location();
          iVar9 = *piVar6;
          data->size_ = 0;
          data->accessTime_ = 0;
          data->birthTime_ = 0;
          data->metadataChangeTime_ = 0;
          data->modificationTime_ = 0;
          data->userId_ = 0xfffffffe;
          data->groupId_ = 0xfffffffe;
          (data->knownFlagsMask).super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
          super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i =
               (data->knownFlagsMask).
               super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
               super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i | 0x72e67077;
        }
      }
      else {
        pcVar8 = local_158.d.ptr;
        if ((statx *)local_158.d.ptr == (statx *)0x0) {
          pcVar8 = "";
        }
        iVar3 = qt_real_statx(-100,pcVar8,0x100,&local_138);
        if (iVar3 == 0) {
          iVar3 = 1;
          uVar7 = (uint)local_138.stx_mode;
        }
        else {
          uVar7 = 0;
          if (iVar3 == -0x26) {
            __file = local_158.d.ptr;
            if ((statx *)local_158.d.ptr == (statx *)0x0) {
              __file = "";
            }
            pcVar8 = (char *)&local_138;
            iVar3 = lstat64(__file,(stat64 *)pcVar8);
            uVar7 = 0;
            if (iVar3 == 0) {
              iVar3 = 0;
              uVar7 = local_138.stx_gid;
            }
          }
        }
        if (iVar3 < 0) {
          piVar6 = __errno_location();
          iVar9 = *piVar6;
          (data->knownFlagsMask).super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
          super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i =
               (data->knownFlagsMask).
               super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
               super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i | 0x400000;
        }
        else if ((uVar7 & 0xf000) == 0xa000) {
          pbVar1 = (byte *)((long)&(data->entryFlags).
                                   super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
                                   super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i + 2);
          *pbVar1 = *pbVar1 | 1;
          iVar3 = -1;
          iVar9 = 0;
        }
        else if (iVar3 == 0) {
          QFileSystemMetaData::fillFromStatBuf(data,(stat64 *)&local_138);
          iVar9 = 0;
          iVar3 = 0;
        }
        else {
          MVar4 = flagsFromStMode((uint)local_138.stx_mode,(quint64)pcVar8);
          uVar7 = (data->entryFlags).super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>
                  .super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i |
                  (uint)MVar4.super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
                        super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i;
          (data->entryFlags).super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
          super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i = uVar7;
          (data->knownFlagsMask).super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
          super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i =
               (uint)MVar4.super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
                     super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i |
               (data->knownFlagsMask).
               super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
               super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i | 0x72a67077;
          if (local_138.stx_nlink == 0) {
            (data->entryFlags).super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
            super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i = uVar7 | 0x40000000;
          }
          data->size_ = local_138.stx_size;
          data->accessTime_ =
               (long)(local_138.stx_atime.tv_sec * 1000000000 + (ulong)local_138.stx_atime.tv_nsec)
               / 1000000;
          data->metadataChangeTime_ =
               (long)(local_138.stx_ctime.tv_sec * 1000000000 + (ulong)local_138.stx_ctime.tv_nsec)
               / 1000000;
          data->modificationTime_ =
               (long)(local_138.stx_mtime.tv_sec * 1000000000 + (ulong)local_138.stx_mtime.tv_nsec)
               / 1000000;
          iVar9 = 0;
          if ((local_138.stx_mask._1_1_ & 8) == 0) {
            lVar11 = 0;
          }
          else {
            lVar11 = (long)(local_138.stx_btime.tv_sec * 1000000000 +
                           (ulong)local_138.stx_btime.tv_nsec) / 1000000;
          }
          data->birthTime_ = lVar11;
          data->userId_ = local_138.stx_uid;
          data->groupId_ = local_138.stx_gid;
        }
        pbVar1 = (byte *)((long)&(data->knownFlagsMask).
                                 super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
                                 super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i + 2);
        *pbVar1 = *pbVar1 | 1;
        if (iVar3 == -1) goto LAB_00171013;
      }
LAB_00171054:
      if ((QVar10.i & 0x400700) != 0) {
        if ((QVar10.i >> 10 & 1) != 0 && iVar9 == 0) {
          pcVar8 = local_158.d.ptr;
          if ((statx *)local_158.d.ptr == (statx *)0x0) {
            pcVar8 = "";
          }
          iVar3 = access(pcVar8,4);
          if (iVar3 == 0) {
            (data->entryFlags).super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
            super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i =
                 (data->entryFlags).super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
                 super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i | 0x400400;
          }
          else {
            piVar6 = __errno_location();
            iVar3 = *piVar6;
            if ((iVar3 != 0xd) && (iVar3 != 0x1e)) {
              iVar9 = iVar3;
            }
          }
        }
        if ((QVar10.i >> 9 & 1) != 0 && iVar9 == 0) {
          pcVar8 = local_158.d.ptr;
          if ((statx *)local_158.d.ptr == (statx *)0x0) {
            pcVar8 = "";
          }
          iVar3 = access(pcVar8,2);
          if (iVar3 == 0) {
            (data->entryFlags).super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
            super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i =
                 (data->entryFlags).super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
                 super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i | 0x400200;
          }
          else {
            piVar6 = __errno_location();
            iVar3 = *piVar6;
            if ((iVar3 != 0xd) && (iVar3 != 0x1e)) {
              iVar9 = iVar3;
            }
          }
        }
        if ((QVar10.i >> 8 & 1) != 0 && iVar9 == 0) {
          pcVar8 = local_158.d.ptr;
          if ((statx *)local_158.d.ptr == (statx *)0x0) {
            pcVar8 = "";
          }
          iVar3 = access(pcVar8,1);
          if (iVar3 == 0) {
            (data->entryFlags).super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
            super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i =
                 (data->entryFlags).super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
                 super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i | 0x400100;
          }
          else {
            piVar6 = __errno_location();
            iVar3 = *piVar6;
            if ((iVar3 != 0xd) && (iVar3 != 0x1e)) {
              iVar9 = iVar3;
            }
          }
        }
        if ((iVar9 == 0) &&
           (((data->entryFlags).super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
             super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i & 0x400000) == 0)) {
          pcVar8 = local_158.d.ptr;
          if ((statx *)local_158.d.ptr == (statx *)0x0) {
            pcVar8 = "";
          }
          iVar3 = access(pcVar8,0);
          if (iVar3 == -1) {
            piVar6 = __errno_location();
            iVar9 = *piVar6;
          }
          else {
            pbVar1 = (byte *)((long)&(data->entryFlags).
                                     super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>
                                     .super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i + 2);
            *pbVar1 = *pbVar1 | 0x40;
          }
        }
        (data->knownFlagsMask).super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
        super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i =
             QVar10.i & 0x700 |
             (data->knownFlagsMask).super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
             super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i | 0x400000;
      }
      if (((QVar10.i >> 0x14 & 1) != 0) &&
         (((data->entryFlags).super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
           super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i & 0x100000) == 0)) {
        local_178.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_178.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_178.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
        QFileSystemEntry::fileName(&local_178,entry);
        bVar2 = QString::startsWith(&local_178,(QChar)0x2e,CaseSensitive);
        if (bVar2) {
          pbVar1 = (byte *)((long)&(data->entryFlags).
                                   super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
                                   super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i + 2);
          *pbVar1 = *pbVar1 | 0x10;
        }
        pbVar1 = (byte *)((long)&(data->knownFlagsMask).
                                 super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
                                 super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i + 2);
        *pbVar1 = *pbVar1 | 0x10;
        if (&(local_178.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_178.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_178.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_178.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
          {
            QArrayData::deallocate(&(local_178.d.d)->super_QArrayData,2,0x10);
          }
        }
      }
      bVar2 = iVar9 == 0;
      if (!bVar2) {
        (data->knownFlagsMask).super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
        super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i =
             (data->knownFlagsMask).super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
             super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i & (~QVar10.i | 0x10000);
      }
      if (&(local_158.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_158.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_158.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_158.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_158.d.d)->super_QArrayData,1,0x10);
        }
      }
      goto LAB_0017138c;
    }
  }
  piVar6 = __errno_location();
  *piVar6 = 0x16;
  bVar2 = false;
LAB_0017138c:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar2;
}

Assistant:

bool QFileSystemEngine::fillMetaData(const QFileSystemEntry &entry, QFileSystemMetaData &data,
        QFileSystemMetaData::MetaDataFlags what)
{
    Q_CHECK_FILE_NAME(entry, false);

#if defined(Q_OS_DARWIN)
    if (what & (QFileSystemMetaData::BundleType | QFileSystemMetaData::CaseSensitive)) {
        if (!data.hasFlags(QFileSystemMetaData::DirectoryType))
            what |= QFileSystemMetaData::DirectoryType;
    }
    if (what & QFileSystemMetaData::AliasType)
        what |= QFileSystemMetaData::LinkType;
#endif
#ifdef UF_HIDDEN
    if (what & QFileSystemMetaData::HiddenAttribute) {
        // OS X >= 10.5: st_flags & UF_HIDDEN
        what |= QFileSystemMetaData::PosixStatFlags;
    }
#endif // defined(Q_OS_DARWIN)

    // if we're asking for any of the stat(2) flags, then we're getting them all
    if (what & QFileSystemMetaData::PosixStatFlags)
        what |= QFileSystemMetaData::PosixStatFlags;

    data.entryFlags &= ~what;

    const QByteArray nativeFilePath = entry.nativeFilePath();
    int entryErrno = 0; // innocent until proven otherwise

    // first, we may try lstat(2). Possible outcomes:
    //  - success and is a symlink: filesystem entry exists, but we need stat(2)
    //    -> statResult = -1;
    //  - success and is not a symlink: filesystem entry exists and we're done
    //    -> statResult = 0
    //  - failure: really non-existent filesystem entry
    //    -> entryExists = false; statResult = 0;
    //    both stat(2) and lstat(2) may generate a number of different errno
    //    conditions, but of those, the only ones that could happen and the
    //    entry still exist are EACCES, EFAULT, ENOMEM and EOVERFLOW. If we get
    //    EACCES or ENOMEM, then we have no choice on how to proceed, so we may
    //    as well conclude it doesn't exist; EFAULT can't happen and EOVERFLOW
    //    shouldn't happen because we build in _LARGEFIE64.
    union {
        QT_STATBUF statBuffer;
        struct statx statxBuffer;
    };
    int statResult = -1;
    if (what & QFileSystemMetaData::LinkType) {
        mode_t mode = 0;
        statResult = qt_lstatx(nativeFilePath, &statxBuffer);
        if (statResult == -ENOSYS) {
            // use lstst(2)
            statResult = QT_LSTAT(nativeFilePath, &statBuffer);
            if (statResult == 0)
                mode = statBuffer.st_mode;
        } else if (statResult == 0) {
            statResult = 1; // record it was statx(2) that succeeded
            mode = statxBuffer.stx_mode;
        }

        if (statResult >= 0) {
            if (S_ISLNK(mode)) {
               // it's a symlink, we don't know if the file "exists"
                data.entryFlags |= QFileSystemMetaData::LinkType;
                statResult = -1;    // force stat(2) below
            } else {
                // it's a reagular file and it exists
                if (statResult)
                    data.fillFromStatxBuf(statxBuffer);
                else
                    data.fillFromStatBuf(statBuffer);
            }
        } else {
            // it doesn't exist
            entryErrno = errno;
            data.knownFlagsMask |= QFileSystemMetaData::ExistsAttribute;
        }

        data.knownFlagsMask |= QFileSystemMetaData::LinkType;
    }

    // second, we try a regular stat(2)
    if (statResult == -1 && (what & QFileSystemMetaData::PosixStatFlags)) {
        if (entryErrno == 0 && statResult == -1) {
            data.entryFlags &= ~QFileSystemMetaData::PosixStatFlags;
            statResult = qt_statx(nativeFilePath, &statxBuffer);
            if (statResult == -ENOSYS) {
                // use stat(2)
                statResult = QT_STAT(nativeFilePath, &statBuffer);
                if (statResult == 0)
                    data.fillFromStatBuf(statBuffer);
            } else if (statResult == 0) {
                data.fillFromStatxBuf(statxBuffer);
            }
        }

        if (statResult != 0) {
            entryErrno = errno;
            data.birthTime_ = 0;
            data.metadataChangeTime_ = 0;
            data.modificationTime_ = 0;
            data.accessTime_ = 0;
            data.size_ = 0;
            data.userId_ = (uint) -2;
            data.groupId_ = (uint) -2;

            // reset the mask
            data.knownFlagsMask |= QFileSystemMetaData::PosixStatFlags
                | QFileSystemMetaData::ExistsAttribute;
        }
    }

    // third, we try access(2)
    if (what & (QFileSystemMetaData::UserPermissions | QFileSystemMetaData::ExistsAttribute)) {
#if defined(Q_OS_VXWORKS)
        // on VxWorks if the filesystem is not POSIX, access() always returns false, despite the
        // file is readable
        struct statfs statBuf;
        if (statfs(nativeFilePath, &statBuf) != 0) {
            what &= ~QFileSystemMetaData::LinkType; // don't clear link: could be broken symlink
            data.clearFlags(what);
            return false;
        }
        if (statBuf.f_type != NFSV2_MAGIC && statBuf.f_type != NFSV3_MAGIC &&
            statBuf.f_type != HRFS_MAGIC) {
#if __has_include(<dosFsLib.h>)
            if (data.entryFlags & QFileSystemMetaData::OwnerWritePermission) {
                data.entryFlags |= QFileSystemMetaData::UserWritePermission;
            }
            if (data.entryFlags & QFileSystemMetaData::OwnerExecutePermission) {
                data.entryFlags |= QFileSystemMetaData::UserExecutePermission;
            }
#endif
            data.entryFlags |= QFileSystemMetaData::UserReadPermission |
                    QFileSystemMetaData::ExistsAttribute;
            return true;
        }
#endif
        // calculate user permissions
        auto checkAccess = [&](QFileSystemMetaData::MetaDataFlag flag, int mode) {
            if (entryErrno != 0 || (what & flag) == 0)
                return;
            if (QT_ACCESS(nativeFilePath, mode) == 0) {
                // access ok (and file exists)
                data.entryFlags |= flag | QFileSystemMetaData::ExistsAttribute;
            } else if (errno != EACCES && errno != EROFS) {
                entryErrno = errno;
            }
        };
        checkAccess(QFileSystemMetaData::UserReadPermission, R_OK);
        checkAccess(QFileSystemMetaData::UserWritePermission, W_OK);
        checkAccess(QFileSystemMetaData::UserExecutePermission, X_OK);

        // if we still haven't found out if the file exists, try F_OK
        if (entryErrno == 0 && (data.entryFlags & QFileSystemMetaData::ExistsAttribute) == 0) {
            if (QT_ACCESS(nativeFilePath, F_OK) == -1)
                entryErrno = errno;
            else
                data.entryFlags |= QFileSystemMetaData::ExistsAttribute;
        }

        data.knownFlagsMask |= (what & QFileSystemMetaData::UserPermissions) |
                QFileSystemMetaData::ExistsAttribute;
    }

#if defined(Q_OS_DARWIN)
    if (what & QFileSystemMetaData::AliasType) {
        if (entryErrno == 0 && hasResourcePropertyFlag(data, entry, kCFURLIsAliasFileKey)) {
            // kCFURLIsAliasFileKey includes symbolic links, so filter those out
            if (!(data.entryFlags & QFileSystemMetaData::LinkType))
                data.entryFlags |= QFileSystemMetaData::AliasType;
        }
        data.knownFlagsMask |= QFileSystemMetaData::AliasType;
    }

    if (what & QFileSystemMetaData::BundleType) {
        if (entryErrno == 0 && isPackage(data, entry))
            data.entryFlags |= QFileSystemMetaData::BundleType;

        data.knownFlagsMask |= QFileSystemMetaData::BundleType;
    }

    if (what & QFileSystemMetaData::CaseSensitive) {
        if (entryErrno == 0 && hasResourcePropertyFlag(
            data, entry, kCFURLVolumeSupportsCaseSensitiveNamesKey))
            data.entryFlags |= QFileSystemMetaData::CaseSensitive;
        data.knownFlagsMask |= QFileSystemMetaData::CaseSensitive;
    }
#endif

    if (what & QFileSystemMetaData::HiddenAttribute
            && !data.isHidden()) {
        QString fileName = entry.fileName();
        if (fileName.startsWith(u'.')
#if defined(Q_OS_DARWIN)
                || (entryErrno == 0 && hasResourcePropertyFlag(data, entry, kCFURLIsHiddenKey))
#endif
                )
            data.entryFlags |= QFileSystemMetaData::HiddenAttribute;
        data.knownFlagsMask |= QFileSystemMetaData::HiddenAttribute;
    }

    if (entryErrno != 0) {
        what &= ~QFileSystemMetaData::LinkType; // don't clear link: could be broken symlink
        data.clearFlags(what);
        return false;
    }
    return true;
}